

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-stack-opts.cpp
# Opt level: O2

bool __thiscall
wasm::StackIROptimizer::canRemoveSetGetPair(StackIROptimizer *this,Index setIndex,Index getIndex)

{
  Op OVar1;
  pointer ppSVar2;
  StackInst *pSVar3;
  Expression *pEVar4;
  bool bVar5;
  LocalSet *pLVar6;
  Type TVar7;
  StackIR *pSVar8;
  uint uVar9;
  ulong uVar10;
  byte bVar11;
  ulong uVar12;
  initializer_list<bool> __l;
  reference rVar13;
  reference rVar14;
  undefined1 local_70 [8];
  vector<bool,_std::allocator<bool>_> coverStack;
  bool local_3a;
  allocator_type local_39;
  int local_38;
  int local_34;
  
  if (getIndex <= setIndex) {
    __assert_fail("setIndex < getIndex",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm/wasm-stack-opts.cpp"
                  ,0x1a0,"bool wasm::StackIROptimizer::canRemoveSetGetPair(Index, Index)");
  }
  pLVar6 = Expression::cast<wasm::LocalSet>
                     ((this->insts->
                      super__Vector_base<wasm::StackInst_*,_std::allocator<wasm::StackInst_*>_>).
                      _M_impl.super__Vector_impl_data._M_start[setIndex]->origin);
  TVar7 = Function::getLocalType(this->func,pLVar6->index);
  if ((TVar7.id < 2) || ((TVar7.id & 1) != 0 && 6 < TVar7.id)) {
    __assert_fail("localType.isSingle()",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm/wasm-stack-opts.cpp"
                  ,0x1a7,"bool wasm::StackIROptimizer::canRemoveSetGetPair(Index, Index)");
  }
  coverStack.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_end_of_storage = (_Bit_pointer)pLVar6;
  bVar5 = Function::isParam(this->func,pLVar6->index);
  bVar11 = 1;
  if ((!bVar5) && ((TVar7.id & 3) == 0 && 6 < TVar7.id)) {
    local_3a = false;
    __l._M_len = 1;
    __l._M_array = &local_3a;
    std::vector<bool,_std::allocator<bool>_>::vector
              ((vector<bool,_std::allocator<bool>_> *)local_70,__l,&local_39);
    uVar9 = setIndex + 1;
    local_38 = 0;
    local_34 = 0;
    while( true ) {
      uVar10 = (ulong)uVar9;
      pSVar8 = this->insts;
      ppSVar2 = (pSVar8->super__Vector_base<wasm::StackInst_*,_std::allocator<wasm::StackInst_*>_>).
                _M_impl.super__Vector_impl_data._M_start;
      uVar12 = (long)(pSVar8->
                     super__Vector_base<wasm::StackInst_*,_std::allocator<wasm::StackInst_*>_>).
                     _M_impl.super__Vector_impl_data._M_finish - (long)ppSVar2 >> 3;
      if (uVar12 <= uVar10) break;
      pSVar3 = ppSVar2[uVar10];
      if (pSVar3 != (StackInst *)0x0) {
        OVar1 = pSVar3->op;
        if (OVar1 < (TryTableEnd|BlockBegin)) {
          if ((0x58a4U >> (OVar1 & 0x1f) & 1) == 0) {
            if ((0x214aU >> (OVar1 & 0x1f) & 1) == 0) {
              if ((0x610U >> (OVar1 & 0x1f) & 1) == 0) goto LAB_00cf8bd1;
              if (local_34 == 0) goto LAB_00cf8c2c;
              rVar13 = std::vector<bool,_std::allocator<bool>_>::back
                                 ((vector<bool,_std::allocator<bool>_> *)local_70);
              uVar10 = *rVar13._M_p;
              rVar14 = std::vector<bool,_std::allocator<bool>_>::back
                                 ((vector<bool,_std::allocator<bool>_> *)local_70);
              local_38 = local_38 + -1 + (uint)((uVar10 & rVar13._M_mask) == 0);
              *rVar14._M_p = *rVar14._M_p & ~rVar14._M_mask;
            }
            else {
              std::vector<bool,_std::allocator<bool>_>::push_back
                        ((vector<bool,_std::allocator<bool>_> *)local_70,false);
              local_34 = local_34 + 1;
            }
          }
          else {
            if (local_34 == 0) {
LAB_00cf8c2c:
              pSVar8 = (StackIR *)0x1;
              break;
            }
            rVar13 = std::vector<bool,_std::allocator<bool>_>::back
                               ((vector<bool,_std::allocator<bool>_> *)local_70);
            local_34 = local_34 + -1;
            local_38 = local_38 + -1 + (uint)((rVar13._M_mask & *rVar13._M_p) == 0);
            bVar5 = (int)coverStack.super__Bvector_base<std::allocator<bool>_>._M_impl.
                         super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p == 0;
            coverStack.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
            _M_finish.super__Bit_iterator_base._M_p._0_4_ =
                 (int)coverStack.super__Bvector_base<std::allocator<bool>_>._M_impl.
                      super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p + -1;
            if (bVar5) {
              coverStack.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data
              ._M_finish.super__Bit_iterator_base._M_p._0_4_ = 0x3f;
              coverStack.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data
              ._M_start.super__Bit_iterator_base._8_8_ =
                   coverStack.super__Bvector_base<std::allocator<bool>_>._M_impl.
                   super__Bvector_impl_data._M_start.super__Bit_iterator_base._8_8_ + -8;
            }
          }
        }
        else {
LAB_00cf8bd1:
          pEVar4 = pSVar3->origin;
          if (pEVar4->_id == LocalGetId) {
            if (((*(int *)(pEVar4 + 1) ==
                  (int)coverStack.super__Bvector_base<std::allocator<bool>_>._M_impl.
                       super__Bvector_impl_data._M_end_of_storage[2]) && (getIndex != uVar9)) &&
               (local_38 == 0)) {
              pSVar8 = (StackIR *)0x0;
              break;
            }
          }
          else if ((pEVar4->_id == LocalSetId) &&
                  (*(int *)(pEVar4 + 1) ==
                   (int)coverStack.super__Bvector_base<std::allocator<bool>_>._M_impl.
                        super__Bvector_impl_data._M_end_of_storage[2])) {
            rVar13 = std::vector<bool,_std::allocator<bool>_>::back
                               ((vector<bool,_std::allocator<bool>_> *)local_70);
            if ((*rVar13._M_p & rVar13._M_mask) == 0) {
              if (local_34 == 0) goto LAB_00cf8c2c;
              rVar13 = std::vector<bool,_std::allocator<bool>_>::back
                                 ((vector<bool,_std::allocator<bool>_> *)local_70);
              local_38 = local_38 + 1;
              *rVar13._M_p = *rVar13._M_p | rVar13._M_mask;
            }
          }
        }
      }
      uVar9 = uVar9 + 1;
    }
    bVar11 = uVar12 <= uVar10 | (byte)pSVar8;
    std::_Bvector_base<std::allocator<bool>_>::~_Bvector_base
              ((_Bvector_base<std::allocator<bool>_> *)local_70);
  }
  return (bool)(bVar11 & 1);
}

Assistant:

bool StackIROptimizer::canRemoveSetGetPair(Index setIndex, Index getIndex) {
  // The set must be before the get.
  assert(setIndex < getIndex);

  auto* set = insts[setIndex]->origin->cast<LocalSet>();
  auto localType = func->getLocalType(set->index);
  // Note we do not need to handle tuples here, as the parent ignores them
  // anyhow (hence we can check non-nullability instead of non-
  // defaultability).
  assert(localType.isSingle());
  if (func->isParam(set->index) || !localType.isNonNullable()) {
    // This local cannot pose a problem for validation (params are always
    // initialized, and it is ok if nullable locals are uninitialized).
    return true;
  }

  // Track the depth (in block/if/loop/etc. scopes) relative to our starting
  // point. Anything less deep than that is not interesting, as we can only
  // help things at our depth or deeper to validate.
  Index currDepth = 0;

  // Look for a different get than the one in getIndex (since that one is
  // being removed) which would stop validating without the set. While doing
  // so, note other sets that ensure validation even if our set is removed. We
  // track those in this stack of booleans, one for each scope, which is true
  // if another sets covers us and ours is not needed.
  //
  // We begin in the current scope and with no other set covering us.
  std::vector<bool> coverStack = {false};

  // Track the total number of covers as well, for quick checking below.
  Index covers = 0;

  // TODO: We could look before us as well, but then we might end up scanning
  //       much of the function every time.
  for (Index i = setIndex + 1; i < insts.size(); i++) {
    auto* inst = insts[i];
    if (!inst) {
      continue;
    }
    if (isControlFlowBegin(inst)) {
      // A new scope begins.
      currDepth++;
      coverStack.push_back(false);
    } else if (isControlFlowEnd(inst)) {
      if (currDepth == 0) {
        // Less deep than the start, so we found no problem.
        return true;
      }
      currDepth--;

      if (coverStack.back()) {
        // A cover existed in the scope which ended.
        covers--;
      }
      coverStack.pop_back();
    } else if (isControlFlowBarrier(inst)) {
      // A barrier, like the else in an if-else, not only ends a scope but
      // opens a new one.
      if (currDepth == 0) {
        // Another scope with the same depth begins, but ours ended, so stop.
        return true;
      }

      if (coverStack.back()) {
        // A cover existed in the scope which ended.
        covers--;
      }
      coverStack.back() = false;
    } else if (auto* otherSet = inst->origin->dynCast<LocalSet>()) {
      // We are covered in this scope henceforth.
      if (otherSet->index == set->index) {
        if (!coverStack.back()) {
          covers++;
          if (currDepth == 0) {
            // We have a cover at depth 0, so everything from here on out
            // will be covered.
            return true;
          }
          coverStack.back() = true;
        }
      }
    } else if (auto* otherGet = inst->origin->dynCast<LocalGet>()) {
      if (otherGet->index == set->index && i != getIndex && !covers) {
        // We found a get that might be a problem: it uses the same index, but
        // is not the get we were told about, and no other set covers us.
        return false;
      }
    }
  }

  // No problem.
  return true;
}